

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

double ClipperLib::Area(OutRec *outRec,bool UseFullInt64Range)

{
  OutPt **ppOVar1;
  IntPoint *pIVar2;
  IntPoint *pIVar3;
  OutPt *pOVar4;
  OutPt *pOVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  double a;
  double dVar9;
  Int128 local_b0;
  long local_a0;
  long local_98;
  Int128 local_90;
  long local_80;
  long local_78;
  Int128 local_70;
  Int128 local_60;
  Int128 local_50;
  Int128 local_40;
  
  pOVar5 = outRec->pts;
  if (pOVar5 == (OutPt *)0x0) {
    dVar9 = 0.0;
  }
  else {
    if (UseFullInt64Range) {
      uVar7 = 0;
      lVar6 = 0;
      do {
        local_70.lo = (pOVar5->prev->pt).X;
        local_70.hi = local_70.lo >> 0x3f;
        local_78 = (pOVar5->pt).Y;
        local_80 = local_78 >> 0x3f;
        Int128::operator*(&local_40,&local_70);
        local_90.lo = (pOVar5->pt).X;
        local_90.hi = local_90.lo >> 0x3f;
        local_98 = (pOVar5->prev->pt).Y;
        local_a0 = local_98 >> 0x3f;
        Int128::operator*(&local_50,&local_90);
        Int128::operator-(&local_60,&local_40);
        lVar6 = lVar6 + local_60.hi;
        bVar8 = CARRY8(uVar7,local_60.lo);
        uVar7 = uVar7 + local_60.lo;
        if (bVar8) {
          lVar6 = lVar6 + 1;
        }
        pOVar5 = pOVar5->next;
        local_b0.hi = lVar6;
        local_b0.lo = uVar7;
      } while (pOVar5 != outRec->pts);
      dVar9 = Int128::AsDouble(&local_b0);
    }
    else {
      dVar9 = 0.0;
      pOVar4 = pOVar5;
      do {
        ppOVar1 = &pOVar4->prev;
        pIVar3 = &pOVar4->pt;
        pIVar2 = &pOVar4->pt;
        pOVar4 = pOVar4->next;
        dVar9 = dVar9 + (double)(pIVar3->Y * ((*ppOVar1)->pt).X - ((*ppOVar1)->pt).Y * pIVar2->X);
      } while (pOVar4 != pOVar5);
    }
    dVar9 = dVar9 * 0.5;
  }
  return dVar9;
}

Assistant:

double Area(const OutRec &outRec, bool UseFullInt64Range)
{
  if (!outRec.pts)
    return 0.0;

  OutPt *op = outRec.pts;
  if (UseFullInt64Range) {
    Int128 a(0);
    do {
      a += (Int128(op->prev->pt.X) * Int128(op->pt.Y)) -
        Int128(op->pt.X) * Int128(op->prev->pt.Y);
      op = op->next;
    } while (op != outRec.pts);
    return a.AsDouble() / 2;
  }
  else
  {
    double a = 0;
    do {
      a += (op->prev->pt.X * op->pt.Y) - (op->pt.X * op->prev->pt.Y);
      op = op->next;
    } while (op != outRec.pts);
    return a/2;
  }
}